

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1ConvolveXHighbdCompoundTest_RunTest_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AV1ConvolveXHighbdCompoundTest_RunTest_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<(anonymous_namespace)::TestParam<void(*)(unsigned_short_const*,int,unsigned_short*,int,int,int,InterpFilterParams_const*,int,ConvolveParams*,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x1cb80);
  anon_unknown.dwarf_14fcaed::AV1ConvolveXHighbdCompoundTest::AV1ConvolveXHighbdCompoundTest
            ((AV1ConvolveXHighbdCompoundTest *)this_00);
  (((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*,_int)>
     *)&this_00->_vptr_Test)->
  super_TestWithParam<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*,_int)>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f3d708;
  this_00[1]._vptr_Test = (_func_int **)&PTR__AV1ConvolveXHighbdCompoundTest_RunTest_Test_00f3d758;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }